

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_hsort_is_sorted(uchar *elements,size_t n,size_t len)

{
  int iVar1;
  size_t in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  ulong local_20;
  
  local_20 = 1;
  while( true ) {
    if (in_RSI <= local_20) {
      return;
    }
    iVar1 = secp256k1_memcmp_var
                      ((void *)(in_RDI + (local_20 - 1) * in_RDX),
                       (void *)(in_RDI + local_20 * in_RDX),in_RDX);
    if (0 < iVar1) break;
    local_20 = local_20 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
          ,0xdfd,
          "test condition failed: secp256k1_memcmp_var(&elements[(i-1) * len], &elements[i * len], len) <= 0"
         );
  abort();
}

Assistant:

static void test_hsort_is_sorted(unsigned char *elements, size_t n, size_t len) {
    size_t i;
    for (i = 1; i < n; i++) {
        CHECK(secp256k1_memcmp_var(&elements[(i-1) * len], &elements[i * len], len) <= 0);
    }
}